

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void insertion_sort<8u>(Cacheblock<8U>_conflict *cache,int n,size_t depth)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  Cacheblock<8U>_conflict *pCVar4;
  Cacheblock<8U>_conflict *pCVar5;
  size_t sVar6;
  
  pCVar4 = cache;
  do {
    if (n < 2) {
      return;
    }
    n = n + -1;
    puVar3 = pCVar4[1].ptr;
    pCVar4 = pCVar4 + 1;
    for (pCVar5 = pCVar4; cache < pCVar5; pCVar5 = pCVar5 + -1) {
      sVar6 = depth;
      while( true ) {
        bVar1 = pCVar5[-1].ptr[sVar6];
        bVar2 = puVar3[sVar6];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        sVar6 = sVar6 + 1;
      }
      if (bVar1 <= bVar2) break;
      pCVar5->ptr = pCVar5[-1].ptr;
    }
    pCVar5->ptr = puVar3;
  } while( true );
}

Assistant:

static inline void
insertion_sort(Cacheblock<CachedChars>* cache, int n, size_t depth)
{
	Cacheblock<CachedChars> *pi, *pj;
	unsigned char *s, *t;
	for (pi = cache + 1; --n > 0; ++pi) {
		unsigned char* tmp = pi->ptr;
		for (pj = pi; pj > cache; --pj) {
			for (s=(pj-1)->ptr+depth, t=tmp+depth; *s==*t && *s!=0;
					++s, ++t)
				;
			if (*s <= *t)
				break;
			pj->ptr = (pj-1)->ptr;
		}
		pj->ptr = tmp;
	}
}